

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Track::ParseContentEncodingsEntry(Track *this,longlong start,longlong size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ContentEncoding **ppCVar3;
  long lVar4;
  ContentEncoding *this_00;
  ContentEncoding *local_b0;
  ContentEncoding *content_encoding;
  long status_1;
  longlong size_2;
  longlong id_1;
  long status;
  longlong size_1;
  longlong id;
  long lStack_40;
  int count;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  longlong size_local;
  longlong start_local;
  Track *this_local;
  
  pos = (longlong)this->m_pSegment->m_pReader;
  pReader = (IMkvReader *)size;
  size_local = start;
  start_local = (longlong)this;
  if ((IMkvReader *)pos == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x133f,"long mkvparser::Track::ParseContentEncodingsEntry(long long, long long)")
    ;
  }
  lStack_40 = start + size;
  id._4_4_ = 0;
  stop = start;
  do {
    if (lStack_40 <= stop) {
      if (id._4_4_ < 1) {
        return -1;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)id._4_4_;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      ppCVar3 = (ContentEncoding **)operator_new__(uVar2,(nothrow_t *)&std::nothrow);
      this->content_encoding_entries_ = ppCVar3;
      if (this->content_encoding_entries_ != (ContentEncoding **)0x0) {
        this->content_encoding_entries_end_ = this->content_encoding_entries_;
        stop = size_local;
        while( true ) {
          if (lStack_40 <= stop) {
            if (stop != lStack_40) {
              return -2;
            }
            return 0;
          }
          lVar4 = ParseElementHeader((IMkvReader *)pos,&stop,lStack_40,&size_2,&status_1);
          if (lVar4 < 0) break;
          if (size_2 == 0x6240) {
            this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
            local_b0 = (ContentEncoding *)0x0;
            if (this_00 != (ContentEncoding *)0x0) {
              ContentEncoding::ContentEncoding(this_00);
              local_b0 = this_00;
            }
            if (local_b0 == (ContentEncoding *)0x0) {
              return -1;
            }
            lVar4 = ContentEncoding::ParseContentEncodingEntry
                              (local_b0,stop,status_1,(IMkvReader *)pos);
            if (lVar4 != 0) {
              if (local_b0 == (ContentEncoding *)0x0) {
                return lVar4;
              }
              ContentEncoding::~ContentEncoding(local_b0);
              operator_delete(local_b0);
              return lVar4;
            }
            ppCVar3 = this->content_encoding_entries_end_;
            this->content_encoding_entries_end_ = ppCVar3 + 1;
            *ppCVar3 = local_b0;
          }
          stop = status_1 + stop;
          if (lStack_40 < stop) {
            return -2;
          }
        }
        return lVar4;
      }
      return -1;
    }
    id_1 = ParseElementHeader((IMkvReader *)pos,&stop,lStack_40,&size_1,&status);
    if (id_1 < 0) {
      return id_1;
    }
    if (size_1 == 0x6240) {
      id._4_4_ = id._4_4_ + 1;
    }
    stop = status + stop;
  } while (stop <= lStack_40);
  return -2;
}

Assistant:

long Track::ParseContentEncodingsEntry(long long start, long long size) {
  IMkvReader* const pReader = m_pSegment->m_pReader;
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentEncoding elements.
  int count = 0;
  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding)
      ++count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (count <= 0)
    return -1;

  content_encoding_entries_ = new (std::nothrow) ContentEncoding*[count];
  if (!content_encoding_entries_)
    return -1;

  content_encoding_entries_end_ = content_encoding_entries_;

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ContentEncoding* const content_encoding =
          new (std::nothrow) ContentEncoding();
      if (!content_encoding)
        return -1;

      status = content_encoding->ParseContentEncodingEntry(pos, size, pReader);
      if (status) {
        delete content_encoding;
        return status;
      }

      *content_encoding_entries_end_++ = content_encoding;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}